

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O2

void Diligent::InitVariable(String *Name,String *InitValue,stringstream *OutSS)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)(OutSS + 0x10),"    ");
  poVar1 = std::operator<<(poVar1,(string *)Name);
  poVar1 = std::operator<<(poVar1," = ");
  poVar1 = std::operator<<(poVar1,(string *)InitValue);
  std::operator<<(poVar1,";\n");
  return;
}

Assistant:

void InitVariable(const String& Name, const String& InitValue, std::stringstream& OutSS)
{
    OutSS << "    " << Name << " = " << InitValue << ";\n";
}